

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_key_derivation_output_bytes
          (psa_key_derivation_operation_t *operation,uint8_t *output,size_t output_length)

{
  psa_hmac_internal_data *ppVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  psa_algorithm_t pVar6;
  byte bVar7;
  byte bVar8;
  psa_status_t pVar9;
  psa_status_t pVar10;
  uint uVar11;
  byte bVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  byte bVar16;
  uint8_t *puVar17;
  char cVar18;
  psa_status_t local_158;
  ulong local_140;
  uint8_t *local_128;
  psa_hash_operation_t local_110;
  
  uVar11 = operation->alg;
  uVar14 = uVar11 & 0x2003ffff;
  if ((uVar11 & 0x7f000000) != 0x30000000) {
    uVar14 = uVar11;
  }
  pVar9 = -0x89;
  if (uVar11 != 0) {
    uVar15 = operation->capacity;
    if (uVar15 < output_length) {
      operation->capacity = 0;
      pVar9 = -0x8f;
    }
    else {
      if (uVar15 == 0 && output_length == 0) {
        return -0x8f;
      }
      operation->capacity = uVar15 - output_length;
      uVar11 = uVar14 & 0xffffff00;
      if ((uVar11 == 0x20000300) || (uVar11 == 0x20000200)) {
        uVar14 = uVar14 & 0xff;
        uVar11 = uVar14 - 1;
        bVar7 = (byte)uVar11;
        if ((bVar7 < 0x12) && ((0x39f9fU >> (uVar11 & 0x1f) & 1) != 0)) {
          cVar18 = (&DAT_0013b445)[uVar11 & 0xff];
        }
        else {
          cVar18 = (uVar14 == 0x13) << 6;
        }
        if (output_length == 0) {
          pVar9 = 0;
        }
        else {
          bVar12 = (uVar14 == 0x13) << 6;
          ppVar1 = (psa_hmac_internal_data *)(&(operation->ctx).hkdf.hmac.hash_ctx.ctx.dummy + 4);
          puVar2 = (operation->ctx).hkdf.prk + 0x18;
          puVar3 = (operation->ctx).hkdf.output_block + 0x18;
          local_140 = output_length;
          local_128 = output;
          do {
            while( true ) {
              bVar16 = (operation->ctx).dummy;
              if ((ulong)bVar16 != 0) break;
              bVar16 = bVar12;
              if ((bVar7 < 0x12) && (((0x39f9fU >> (bVar7 & 0x1f) ^ 1) & 1) == 0)) {
                bVar16 = (&DAT_0013b445)[uVar11 & 0xff];
              }
              memset(&local_110,0,0xe0);
              uVar5 = (operation->ctx).tls12_prf.block_number;
              if (uVar5 == 0xff) {
                pVar9 = -0x97;
              }
              else {
                (operation->ctx).tls12_prf.block_number = uVar5 + '\x01';
                (operation->ctx).dummy = bVar16;
                pVar10 = psa_hash_clone((psa_hash_operation_t *)ppVar1,&local_110);
                if (pVar10 == 0) {
                  if ((operation->ctx).tls12_prf.block_number == '\x01') {
                    pVar10 = psa_hash_update((psa_hash_operation_t *)ppVar1,
                                             (operation->ctx).tls12_prf.label,
                                             (operation->ctx).tls12_prf.label_length);
                    if (pVar10 != 0) goto LAB_00111be4;
                    sVar13 = (operation->ctx).tls12_prf.seed_length;
                    puVar17 = (operation->ctx).tls12_prf.seed;
                  }
                  else {
                    sVar13 = (size_t)bVar16;
                    puVar17 = puVar2;
                  }
                  pVar10 = psa_hash_update((psa_hash_operation_t *)ppVar1,puVar17,sVar13);
                  if (pVar10 == 0) {
                    uVar15 = (ulong)bVar16;
                    pVar10 = psa_hmac_finish_internal(ppVar1,puVar2,uVar15);
                    if ((((pVar10 == 0) &&
                         (pVar10 = psa_hash_clone(&local_110,(psa_hash_operation_t *)ppVar1),
                         pVar10 == 0)) &&
                        (pVar10 = psa_hash_update((psa_hash_operation_t *)ppVar1,puVar2,uVar15),
                        pVar10 == 0)) &&
                       (((pVar10 = psa_hash_update((psa_hash_operation_t *)ppVar1,
                                                   (operation->ctx).tls12_prf.label,
                                                   (operation->ctx).tls12_prf.label_length),
                         pVar10 == 0 &&
                         (pVar10 = psa_hash_update((psa_hash_operation_t *)ppVar1,
                                                   (operation->ctx).tls12_prf.seed,
                                                   (operation->ctx).tls12_prf.seed_length),
                         pVar10 == 0)) &&
                        (pVar10 = psa_hmac_finish_internal(ppVar1,puVar3,uVar15), pVar10 == 0)))) {
                      pVar10 = psa_hash_clone(&local_110,(psa_hash_operation_t *)ppVar1);
                    }
                  }
                }
LAB_00111be4:
                pVar9 = psa_hash_abort(&local_110);
                if (pVar9 == 0) {
                  pVar9 = pVar10;
                }
                if (pVar10 != 0) {
                  pVar9 = pVar10;
                }
              }
              if (pVar9 != 0) goto LAB_00111954;
            }
            bVar8 = bVar16;
            if (local_140 < bVar16) {
              bVar8 = (byte)local_140;
            }
            uVar15 = (ulong)bVar8;
            memcpy(local_128,puVar3 + (byte)(cVar18 - bVar16),uVar15);
            (operation->ctx).dummy = (operation->ctx).dummy - bVar8;
            local_128 = local_128 + uVar15;
            pVar9 = 0;
            local_140 = local_140 - uVar15;
          } while (local_140 != 0);
        }
      }
      else {
        if (uVar11 != 0x20000100) {
          return -0x89;
        }
        uVar14 = uVar14 & 0xff;
        uVar11 = uVar14 - 1;
        if (((byte)uVar11 < 0x12) && ((0x39f9fU >> (uVar11 & 0x1f) & 1) != 0)) {
          bVar7 = (&DAT_0013b445)[uVar11 & 0xff];
        }
        else {
          bVar7 = (uVar14 == 0x13) << 6;
        }
        bVar12 = (operation->ctx).tls12_prf.output_block[0x2a];
        if ((~bVar12 & 6) == 0) {
          (operation->ctx).tls12_prf.output_block[0x2a] = bVar12 | 3;
          puVar2 = (operation->ctx).hkdf.output_block;
          puVar3 = &(operation->ctx).hkdf.block_number;
          ppVar1 = &(operation->ctx).hkdf.hmac;
          sVar13 = output_length;
          puVar17 = output;
          do {
            pVar9 = 0;
            if (sVar13 == 0) goto LAB_00111954;
            bVar12 = (operation->ctx).hkdf.offset_in_block;
            bVar8 = bVar7 - bVar12;
            bVar16 = (byte)sVar13;
            if (bVar8 <= sVar13) {
              bVar16 = bVar8;
            }
            uVar15 = (ulong)bVar16;
            memcpy(puVar17,puVar2 + bVar12,uVar15);
            puVar4 = &(operation->ctx).hkdf.offset_in_block;
            *puVar4 = *puVar4 + bVar16;
            sVar13 = sVar13 - uVar15;
            if (sVar13 == 0) {
              cVar18 = '\x03';
            }
            else {
              cVar18 = '\x01';
              if (*puVar3 == 0xff) {
                local_158 = -0x89;
              }
              else {
                (operation->ctx).hkdf.block_number = *puVar3 + '\x01';
                (operation->ctx).hkdf.offset_in_block = '\0';
                pVar10 = psa_hmac_setup_internal
                                   (ppVar1,(operation->ctx).hkdf.prk,(ulong)bVar7,uVar14 | 0x1000000
                                   );
                if (((pVar10 == 0) &&
                    (((*puVar3 == '\x01' ||
                      (pVar10 = psa_hash_update(&ppVar1->hash_ctx,puVar2,(ulong)bVar7), pVar10 == 0)
                      ) && (pVar10 = psa_hash_update(&ppVar1->hash_ctx,(operation->ctx).hkdf.info,
                                                     (operation->ctx).hkdf.info_length), pVar10 == 0
                           )))) &&
                   (pVar10 = psa_hash_update(&ppVar1->hash_ctx,puVar3,1), pVar10 == 0)) {
                  pVar10 = psa_hmac_finish_internal(ppVar1,puVar2,0x40);
                  cVar18 = pVar10 != 0;
                  if ((bool)cVar18) {
                    local_158 = pVar10;
                  }
                }
                else {
                  cVar18 = '\x01';
                  local_158 = pVar10;
                }
              }
            }
            puVar17 = puVar17 + uVar15;
          } while (cVar18 == '\0');
          if (cVar18 != '\x03') {
            pVar9 = local_158;
          }
        }
      }
    }
LAB_00111954:
    if (pVar9 != 0) {
      pVar6 = operation->alg;
      psa_key_derivation_abort(operation);
      operation->alg = pVar6;
      memset(output,0x21,output_length);
    }
  }
  return pVar9;
}

Assistant:

psa_status_t psa_key_derivation_output_bytes(
    psa_key_derivation_operation_t *operation,
    uint8_t *output,
    size_t output_length )
{
    psa_status_t status;
    psa_algorithm_t kdf_alg = psa_key_derivation_get_kdf_alg( operation );

    if( operation->alg == 0 )
    {
        /* This is a blank operation. */
        return PSA_ERROR_BAD_STATE;
    }

    if( output_length > operation->capacity )
    {
        operation->capacity = 0;
        /* Go through the error path to wipe all confidential data now
         * that the operation object is useless. */
        status = PSA_ERROR_INSUFFICIENT_DATA;
        goto exit;
    }
    if( output_length == 0 && operation->capacity == 0 )
    {
        /* Edge case: this is a finished operation, and 0 bytes
         * were requested. The right error in this case could
         * be either INSUFFICIENT_CAPACITY or BAD_STATE. Return
         * INSUFFICIENT_CAPACITY, which is right for a finished
         * operation, for consistency with the case when
         * output_length > 0. */
        return( PSA_ERROR_INSUFFICIENT_DATA );
    }
    operation->capacity -= output_length;

#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HKDF( kdf_alg ) )
    {
        psa_algorithm_t hash_alg = PSA_ALG_HKDF_GET_HASH( kdf_alg );
        status = psa_key_derivation_hkdf_read( &operation->ctx.hkdf, hash_alg,
                                          output, output_length );
    }
    else
    if( PSA_ALG_IS_TLS12_PRF( kdf_alg ) ||
             PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) )
    {
        status = psa_key_derivation_tls12_prf_read( &operation->ctx.tls12_prf,
                                               kdf_alg, output,
                                               output_length );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        return( PSA_ERROR_BAD_STATE );
    }

exit:
    if( status != PSA_SUCCESS )
    {
        /* Preserve the algorithm upon errors, but clear all sensitive state.
         * This allows us to differentiate between exhausted operations and
         * blank operations, so we can return PSA_ERROR_BAD_STATE on blank
         * operations. */
        psa_algorithm_t alg = operation->alg;
        psa_key_derivation_abort( operation );
        operation->alg = alg;
        memset( output, '!', output_length );
    }
    return( status );
}